

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_region_init_riscv64(TCGContext_conflict11 *tcg_ctx)

{
  GTree *pGVar1;
  void *local_58;
  void *end;
  void *start;
  size_t i;
  size_t n_regions;
  size_t region_size;
  size_t page_size;
  size_t size;
  void *aligned;
  void *buf;
  TCGContext_conflict11 *tcg_ctx_local;
  
  aligned = tcg_ctx->code_gen_buffer;
  page_size = tcg_ctx->code_gen_buffer_size;
  region_size = tcg_ctx->uc->qemu_real_host_page_size;
  i = 1;
  size = (((long)aligned + (region_size - 1)) / region_size) * region_size;
  buf = tcg_ctx;
  if ((void *)((long)tcg_ctx->code_gen_buffer + page_size) <= size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
               ,0x1fc,"(char *)aligned < ((char *)tcg_ctx->code_gen_buffer + size)");
  }
  n_regions = (((page_size - (size - (long)aligned)) / 1) / region_size) * region_size;
  if (region_size << 1 <= n_regions) {
    (tcg_ctx->region).n = 1;
    (tcg_ctx->region).size = n_regions - region_size;
    (tcg_ctx->region).stride = n_regions;
    (tcg_ctx->region).start = aligned;
    (tcg_ctx->region).start_aligned = (void *)size;
    (tcg_ctx->region).end = (void *)((((long)aligned + page_size) / region_size) * region_size);
    (tcg_ctx->region).end = (void *)((long)(tcg_ctx->region).end - region_size);
    for (start = (void *)0x0; start < *(void **)((long)buf + 0x8910);
        start = (void *)((long)start + 1)) {
      tcg_region_bounds((TCGContext_conflict11 *)buf,(size_t)start,&end,&local_58);
      qemu_mprotect_none(local_58,region_size);
    }
    pGVar1 = g_tree_new(tb_tc_cmp);
    *(GTree **)((long)buf + 0x8938) = pGVar1;
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
             ,0x206,"region_size >= 2 * page_size");
}

Assistant:

void tcg_region_init(TCGContext *tcg_ctx)
{
    void *buf = tcg_ctx->code_gen_buffer;
    void *aligned;
    size_t size = tcg_ctx->code_gen_buffer_size;
    size_t page_size = tcg_ctx->uc->qemu_real_host_page_size;
    size_t region_size;
    size_t n_regions;
    size_t i;

    n_regions = 1;

    /* The first region will be 'aligned - buf' bytes larger than the others */
    aligned = (void *)QEMU_ALIGN_PTR_UP(buf, page_size);
    g_assert((char *)aligned < ((char *)tcg_ctx->code_gen_buffer + size));
    /*
     * Make region_size a multiple of page_size, using aligned as the start.
     * As a result of this we might end up with a few extra pages at the end of
     * the buffer; we will assign those to the last region.
     */
    region_size = (size - ((char *)aligned - (char *)buf)) / n_regions;
    region_size = QEMU_ALIGN_DOWN(region_size, page_size);

    /* A region must have at least 2 pages; one code, one guard */
    g_assert(region_size >= 2 * page_size);

    /* init the region struct */
    tcg_ctx->region.n = n_regions;
    tcg_ctx->region.size = region_size - page_size;
    tcg_ctx->region.stride = region_size;
    tcg_ctx->region.start = buf;
    tcg_ctx->region.start_aligned = aligned;
    /* page-align the end, since its last page will be a guard page */
    tcg_ctx->region.end = (void *)QEMU_ALIGN_PTR_DOWN((char *)buf + size, page_size);
    /* account for that last guard page */
    tcg_ctx->region.end = (void *)((char *)tcg_ctx->region.end - page_size);

    /* set guard pages */
    for (i = 0; i < tcg_ctx->region.n; i++) {
        void *start, *end;

        tcg_region_bounds(tcg_ctx, i, &start, &end);

        (void)qemu_mprotect_none(end, page_size);
    }

    tcg_ctx->tree = g_tree_new(tb_tc_cmp);

}